

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O2

void compileThreadProc(void)

{
  int iVar1;
  ostream *poVar2;
  FILE *__stream;
  char *pcVar3;
  lock_guard<std::mutex> guard;
  CompileTask task;
  string commandLine;
  ostringstream ss;
  char buf [1024];
  undefined1 local_690 [32];
  _Alloc_hider local_670;
  size_type local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  _Alloc_hider local_650;
  size_type local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  _Alloc_hider local_630;
  size_type local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  string local_5d0 [32];
  ostringstream local_5b0 [376];
  char local_438 [1032];
  
  while( true ) {
    if (g_Terminate != false) {
      return;
    }
    local_690._0_8_ = local_690 + 0x10;
    local_690._8_8_ = 0;
    local_690[0x10] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    local_610._M_string_length = 0;
    local_610.field_2._M_local_buf[0] = '\0';
    std::mutex::lock(&g_TaskMutex);
    if (g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_start ==
        g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    CompileTask::operator=
              ((CompileTask *)local_690,
               g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
               super__Vector_impl_data._M_finish + -1);
    std::vector<CompileTask,_std::allocator<CompileTask>_>::pop_back(&g_CompileTasks);
    pthread_mutex_unlock((pthread_mutex_t *)&g_TaskMutex);
    if (g_Options.verbose == true) {
      std::mutex::lock(&g_ReportMutex);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_610);
      std::endl<char,std::char_traits<char>>(poVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
    }
    std::operator+(&local_5f0,&local_610," 2>&1");
    __stream = popen(local_5f0._M_dataplus._M_p,"r");
    if (__stream == (FILE *)0x0) {
      std::mutex::lock(&g_ReportMutex);
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR: cannot run ");
      poVar2 = std::operator<<(poVar2,(string *)&g_Options.compilerPath);
      std::endl<char,std::char_traits<char>>(poVar2);
      g_CompileSuccess = false;
      g_Terminate = true;
      pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_5b0);
      while (pcVar3 = fgets(local_438,0x400,__stream), pcVar3 != (char *)0x0) {
        std::operator<<((ostream *)local_5b0,local_438);
      }
      iVar1 = pclose(__stream);
      LOCK();
      g_ProcessedTaskCount.super___atomic_base<int>._M_i =
           (__atomic_base<int>)((int)g_ProcessedTaskCount.super___atomic_base<int>._M_i + 1);
      UNLOCK();
      std::mutex::lock(&g_ReportMutex);
      pcVar3 = "FAIL ";
      if (iVar1 == 0) {
        pcVar3 = " OK  ";
      }
      sprintf(local_438,"[%5.1f%%] %s %s %s:%s %s",
              (double)(((float)(int)g_ProcessedTaskCount.super___atomic_base<int>._M_i /
                       (float)g_OriginalTaskCount) * 100.0),
              g_PlatformName_abi_cxx11_._M_dataplus._M_p,pcVar3,local_670._M_p,local_650._M_p,
              local_630._M_p);
      poVar2 = std::operator<<((ostream *)&std::cout,local_438);
      std::endl<char,std::char_traits<char>>(poVar2);
      if ((iVar1 != 0) && (g_Terminate == false)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ERRORS for ");
        poVar2 = std::operator<<(poVar2,(string *)&local_670);
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = std::operator<<(poVar2,(string *)&local_650);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = std::operator<<(poVar2,(string *)&local_630);
        poVar2 = std::operator<<(poVar2,": ");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::stringbuf::str();
        poVar2 = std::operator<<((ostream *)&std::cout,local_5d0);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string(local_5d0);
        g_CompileSuccess = false;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
      std::__cxx11::ostringstream::~ostringstream(local_5b0);
    }
    std::__cxx11::string::~string((string *)&local_5f0);
    CompileTask::~CompileTask((CompileTask *)local_690);
    if (__stream == (FILE *)0x0) {
      return;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&g_TaskMutex);
  CompileTask::~CompileTask((CompileTask *)local_690);
  return;
}

Assistant:

void compileThreadProc()
{
	while (!g_Terminate)
	{
		CompileTask task;
		{
			lock_guard<mutex> guard(g_TaskMutex);
			if (g_CompileTasks.empty())
				return;

			task = g_CompileTasks[g_CompileTasks.size() - 1];
			g_CompileTasks.pop_back();
		}

		if (g_Options.verbose)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << task.commandLine << endl;
		}

		string commandLine = task.commandLine + " 2>&1";

		FILE* pipe = popen(commandLine.c_str(), "r");
		if (!pipe)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << "ERROR: cannot run " << g_Options.compilerPath << endl;
			g_CompileSuccess = false;
			g_Terminate = true;
			return;
		}

		ostringstream ss;
		char buf[1024];
		while (fgets(buf, sizeof(buf), pipe))
			ss << buf;

		int result = pclose(pipe);
		g_ProcessedTaskCount++;

		{
			lock_guard<mutex> guard(g_ReportMutex);

			const char* resultCode = (result == 0) ? " OK  " : "FAIL ";
			float progress = (float)g_ProcessedTaskCount / (float)g_OriginalTaskCount;

			sprintf(buf, "[%5.1f%%] %s %s %s:%s %s", 
				progress * 100.f, 
				g_PlatformName.c_str(), 
				resultCode, 
				task.shaderName.c_str(), 
				task.entryPoint.c_str(), 
				task.combinedDefines.c_str());

			cout << buf << endl;
 
			if (result != 0 && !g_Terminate)
			{
				cout << "ERRORS for " << task.shaderName << ":" << task.entryPoint << " " << task.combinedDefines << ": " << endl;
				cout << ss.str() << endl;
				g_CompileSuccess = false;
			}
		}
	}
}